

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Delaunay3dThread::show_tet(Delaunay3dThread *this,index_t t)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  undefined1 *puVar4;
  char local_40 [5];
  char local_3b [3];
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"tet",3);
  local_40[4] = 0x2a;
  if ((this->cell_next_->
      super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
      super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
      super__Vector_impl_data._M_start[t] == 0xfffffffe) {
    local_40[4] = 0x20;
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_40 + 4,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", v=[",5);
  uVar1 = t * 4;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar1]);
  local_3b[0] = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3b,1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 + 1]);
  local_3b[1] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3b + 1,1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 + 2]);
  local_3b[2] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3b + 2,1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(this->cell_to_v_store_->
                             super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar1 + 3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]  adj=[",8);
  lVar3 = 0;
  show_tet_adjacent(this,t,0);
  show_tet_adjacent(this,t,1);
  show_tet_adjacent(this,t,2);
  show_tet_adjacent(this,t,3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] ",2);
  puVar4 = &tet_facet_vertex_;
  do {
    local_40[0] = 'f';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_40,1);
    local_38 = lVar3;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_40[1] = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40 + 1,1);
    lVar3 = -3;
    do {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (&std::cerr,
                          (this->cell_to_v_store_->
                          super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)(char)puVar4[lVar3 + 3] + uVar1]);
      local_40[3] = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40 + 3,1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    local_40[2] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_40 + 2,1);
    lVar3 = local_38 + 1;
    puVar4 = puVar4 + 3;
  } while (lVar3 != 4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void show_tet(index_t t) const {
            std::cerr << "tet"
                      << (tet_is_in_list(t) ? '*' : ' ')
                      << t
                      << ", v=["
                      << tet_vertex(t, 0)
                      << ' '
                      << tet_vertex(t, 1)
                      << ' '
                      << tet_vertex(t, 2)
                      << ' '
                      << tet_vertex(t, 3)
                      << "]  adj=[";
            show_tet_adjacent(t, 0);
            show_tet_adjacent(t, 1);
            show_tet_adjacent(t, 2);
            show_tet_adjacent(t, 3);
            std::cerr << "] ";
            
            for(index_t f = 0; f < 4; ++f) {
                std::cerr << 'f' << f << ':';
                for(index_t v = 0; v < 3; ++v) {
                    std::cerr << tet_vertex(t, tet_facet_vertex(f,v))
                              << ',';
                }
                std::cerr << ' ';
            }
            std::cerr << std::endl;
        }